

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O2

ssize_t __thiscall
Imf_3_4::anon_unknown_75::MemAttrStream::read
          (MemAttrStream *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  InputExc *this_00;
  ulong uVar2;
  undefined8 unaff_RBP;
  undefined4 in_register_00000034;
  ulong uVar3;
  ulong __n;
  
  uVar1 = this->_pos;
  uVar2 = this->_sz - uVar1;
  if ((int)__buf == 0 || uVar1 <= this->_sz && uVar2 != 0) {
    uVar3 = (ulong)(int)__buf;
    __n = uVar3;
    if (uVar2 < uVar3) {
      __n = uVar2;
    }
    memcpy((void *)CONCAT44(in_register_00000034,__fd),this->_data + uVar1,__n);
    this->_pos = this->_pos + __n;
    return CONCAT71((int7)((ulong)unaff_RBP >> 8),uVar3 < uVar2) & 0xffffffff;
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(this_00,"Unexpected end of file.");
  __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

bool     read (char c[/*n*/], int n) override
    {
        if (_pos >= _sz && n != 0)
            throw IEX_NAMESPACE::InputExc ("Unexpected end of file.");

        uint64_t n2     = n;
        bool     retVal = true;

        if (_sz - _pos <= n2)
        {
            n2     = _sz - _pos;
            retVal = false;
        }

        memcpy (c, _data + _pos, n2);
        _pos += n2;
        return retVal;
    }